

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O3

void psh_blues_set_zones(PSH_Blues target,FT_UInt count,FT_Short *blues,FT_UInt count_others,
                        FT_Short *other_blues,FT_Int fuzz,FT_Int family)

{
  FT_UInt FVar1;
  int iVar2;
  PSH_Blues top_table;
  int iVar3;
  FT_Int *pFVar4;
  FT_UInt FVar5;
  int iVar6;
  int iVar7;
  PSH_Blue_ZoneRec *pPVar8;
  FT_UInt FVar9;
  int iVar10;
  FT_Int FVar11;
  int iVar12;
  undefined4 in_register_0000008c;
  PSH_Blue_Table bot_table;
  int iVar13;
  PSH_Blues read;
  FT_Int *pFVar14;
  bool bVar15;
  
  bot_table = (PSH_Blue_Table)CONCAT44(in_register_0000008c,fuzz);
  read = (PSH_Blues)&target->family_top;
  top_table = (PSH_Blues)&target->family_bottom;
  if (family == 0) {
    read = target;
    top_table = (PSH_Blues)&target->normal_bottom;
  }
  (read->normal_top).count = 0;
  (top_table->normal_top).count = 0;
  psh_blues_set_zones_0
            ((PSH_Blues)0x0,(FT_Bool)count,(FT_UInt)blues,(FT_Short *)read,&top_table->normal_top,
             bot_table);
  psh_blues_set_zones_0
            ((PSH_Blues)&DAT_00000001,(FT_Bool)count_others,(FT_UInt)other_blues,(FT_Short *)read,
             &top_table->normal_top,bot_table);
  FVar5 = (read->normal_top).count;
  FVar1 = (top_table->normal_top).count;
  if (FVar5 != 0) {
    pPVar8 = (read->normal_top).zones;
    FVar9 = FVar5;
    do {
      if (FVar9 == 1) {
        iVar7 = pPVar8->org_ref;
        FVar11 = pPVar8->org_delta;
      }
      else {
        if (FVar9 == 0) break;
        iVar7 = pPVar8->org_ref;
        FVar11 = pPVar8->org_delta;
        iVar10 = pPVar8[1].org_ref - iVar7;
        if (iVar10 < FVar11) {
          pPVar8->org_delta = iVar10;
          FVar11 = iVar10;
        }
      }
      pPVar8->org_bottom = iVar7;
      pPVar8->org_top = FVar11 + iVar7;
      FVar9 = FVar9 - 1;
      pPVar8 = pPVar8 + 1;
    } while( true );
  }
  if (FVar1 != 0) {
    pPVar8 = (top_table->normal_top).zones;
    FVar9 = FVar1;
    do {
      if (FVar9 == 1) {
        iVar7 = pPVar8->org_ref;
        FVar11 = pPVar8->org_delta;
      }
      else {
        if (FVar9 == 0) break;
        iVar7 = pPVar8->org_ref;
        FVar11 = pPVar8->org_delta;
        iVar10 = iVar7 - pPVar8[1].org_ref;
        if (FVar11 < iVar10) {
          pPVar8->org_delta = iVar10;
          FVar11 = iVar10;
        }
      }
      pPVar8->org_top = iVar7;
      pPVar8->org_bottom = FVar11 + iVar7;
      FVar9 = FVar9 - 1;
      pPVar8 = pPVar8 + 1;
    } while( true );
  }
  iVar7 = 1;
  do {
    if (FVar5 != 0) {
      pFVar4 = &(read->normal_top).zones[0].org_bottom;
      *pFVar4 = *pFVar4 - fuzz;
      iVar10 = (read->normal_top).zones[0].org_top;
      iVar6 = FVar5 - 1;
      if (iVar6 == 0) {
        pPVar8 = (read->normal_top).zones;
      }
      else {
        pFVar4 = &(read->normal_top).zones[1].org_bottom;
        FVar11 = iVar10;
        do {
          pFVar14 = pFVar4;
          iVar10 = pFVar14[-1];
          iVar13 = (*pFVar14 - FVar11) / 2;
          iVar12 = iVar13 + FVar11;
          iVar2 = FVar11 + fuzz;
          iVar3 = *pFVar14 - fuzz;
          if (iVar13 < fuzz) {
            iVar2 = iVar12;
            iVar3 = iVar12;
          }
          *pFVar14 = iVar3;
          pFVar14[-0xd] = iVar2;
          iVar6 = iVar6 + -1;
          pFVar4 = pFVar14 + 0xc;
          FVar11 = iVar10;
        } while (iVar6 != 0);
        pPVar8 = (PSH_Blue_ZoneRec *)(pFVar14 + -3);
      }
      pPVar8->org_top = iVar10 + fuzz;
    }
    bVar15 = iVar7 != 0;
    iVar7 = iVar7 + -1;
    read = top_table;
    FVar5 = FVar1;
  } while (bVar15);
  return;
}

Assistant:

static void
  psh_blues_set_zones( PSH_Blues  target,
                       FT_UInt    count,
                       FT_Short*  blues,
                       FT_UInt    count_others,
                       FT_Short*  other_blues,
                       FT_Int     fuzz,
                       FT_Int     family )
  {
    PSH_Blue_Table  top_table, bot_table;
    FT_UInt         count_top, count_bot;


    if ( family )
    {
      top_table = &target->family_top;
      bot_table = &target->family_bottom;
    }
    else
    {
      top_table = &target->normal_top;
      bot_table = &target->normal_bottom;
    }

    /* read the input blue zones, and build two sorted tables  */
    /* (one for the top zones, the other for the bottom zones) */
    top_table->count = 0;
    bot_table->count = 0;

    /* first, the blues */
    psh_blues_set_zones_0( target, 0,
                           count, blues, top_table, bot_table );
    psh_blues_set_zones_0( target, 1,
                           count_others, other_blues, top_table, bot_table );

    count_top = top_table->count;
    count_bot = bot_table->count;

    /* sanitize top table */
    if ( count_top > 0 )
    {
      PSH_Blue_Zone  zone = top_table->zones;


      for ( count = count_top; count > 0; count--, zone++ )
      {
        FT_Int  delta;


        if ( count > 1 )
        {
          delta = zone[1].org_ref - zone[0].org_ref;
          if ( zone->org_delta > delta )
            zone->org_delta = delta;
        }

        zone->org_bottom = zone->org_ref;
        zone->org_top    = zone->org_delta + zone->org_ref;
      }
    }

    /* sanitize bottom table */
    if ( count_bot > 0 )
    {
      PSH_Blue_Zone  zone = bot_table->zones;


      for ( count = count_bot; count > 0; count--, zone++ )
      {
        FT_Int  delta;


        if ( count > 1 )
        {
          delta = zone[0].org_ref - zone[1].org_ref;
          if ( zone->org_delta < delta )
            zone->org_delta = delta;
        }

        zone->org_top    = zone->org_ref;
        zone->org_bottom = zone->org_delta + zone->org_ref;
      }
    }

    /* expand top and bottom tables with blue fuzz */
    {
      FT_Int         dim, top, bot, delta;
      PSH_Blue_Zone  zone;


      zone  = top_table->zones;
      count = count_top;

      for ( dim = 1; dim >= 0; dim-- )
      {
        if ( count > 0 )
        {
          /* expand the bottom of the lowest zone normally */
          zone->org_bottom -= fuzz;

          /* expand the top and bottom of intermediate zones;    */
          /* checking that the interval is smaller than the fuzz */
          top = zone->org_top;

          for ( count--; count > 0; count-- )
          {
            bot   = zone[1].org_bottom;
            delta = bot - top;

            if ( delta / 2 < fuzz )
              zone[0].org_top = zone[1].org_bottom = top + delta / 2;
            else
            {
              zone[0].org_top    = top + fuzz;
              zone[1].org_bottom = bot - fuzz;
            }

            zone++;
            top = zone->org_top;
          }

          /* expand the top of the highest zone normally */
          zone->org_top = top + fuzz;
        }
        zone  = bot_table->zones;
        count = count_bot;
      }
    }
  }